

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

int SimpleString::StrNCmp(char *s1,char *s2,size_t n)

{
  bool bVar1;
  int local_20;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  n_local = n;
  s2_local = s2;
  s1_local = s1;
  while( true ) {
    bVar1 = false;
    if ((n_local != 0) && (bVar1 = false, *s1_local != '\0')) {
      bVar1 = *s1_local == *s2_local;
    }
    if (!bVar1) break;
    n_local = n_local - 1;
    s1_local = s1_local + 1;
    s2_local = s2_local + 1;
  }
  if (n_local == 0) {
    local_20 = 0;
  }
  else {
    local_20 = (uint)(byte)*s1_local - (uint)(byte)*s2_local;
  }
  return local_20;
}

Assistant:

int SimpleString::StrNCmp(const char* s1, const char* s2, size_t n)
{
    while (n && *s1 && *s1 == *s2) {
        n--, s1++, s2++;
    }
    return n ? *(unsigned char *) s1 - *(unsigned char *) s2 : 0;
}